

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void __thiscall google::LogMessage::LogStream::~LogStream(LogStream *this)

{
  ios_base *this_00;
  _func_int *p_Var1;
  
  p_Var1 = (this->super_ostream)._vptr_basic_ostream[-3];
  this_00 = (ios_base *)(&(this->super_ostream).field_0x58 + (long)p_Var1);
  *(undefined ***)(this_00 + -0x58) = &PTR__LogStream_0012e408;
  *(undefined ***)this_00 = &PTR__LogStream_0012e430;
  *(code **)(this_00 + -0x50) = __assert_fail;
  std::locale::~locale((locale *)(&(this->super_ostream).field_0x40 + (long)p_Var1));
  std::ios_base::~ios_base(this_00);
  operator_delete((_func_int *)((long)&(this->super_ostream)._vptr_basic_ostream + (long)p_Var1),
                  0x160);
  return;
}

Assistant:

class GLOG_EXPORT LogStream : public std::ostream {
    GLOG_MSVC_POP_WARNING()
   public:
    // In some cases, like when compiling glog as a static library with GCC and
    // linking against a Clang-built executable, this constructor will be
    // removed by the linker. We use this attribute to prevent the linker from
    // discarding it.
    GLOG_USED
    LogStream(char* buf, int len, int64 ctr)
        : std::ostream(nullptr), streambuf_(buf, len), ctr_(ctr), self_(this) {
      rdbuf(&streambuf_);
    }

    LogStream(LogStream&& other) noexcept
        : std::ostream(nullptr),
          streambuf_(std::move(other.streambuf_)),
          ctr_(std::exchange(other.ctr_, 0)),
          self_(this) {
      rdbuf(&streambuf_);
    }

    LogStream& operator=(LogStream&& other) noexcept {
      streambuf_ = std::move(other.streambuf_);
      ctr_ = std::exchange(other.ctr_, 0);
      rdbuf(&streambuf_);
      return *this;
    }

    int64 ctr() const { return ctr_; }
    void set_ctr(int64 ctr) { ctr_ = ctr; }
    LogStream* self() const { return self_; }

    // Legacy std::streambuf methods.
    size_t pcount() const { return streambuf_.pcount(); }
    char* pbase() const { return streambuf_.pbase(); }
    char* str() const { return pbase(); }

    LogStream(const LogStream&) = delete;
    LogStream& operator=(const LogStream&) = delete;

   private:
    base_logging::LogStreamBuf streambuf_;
    int64 ctr_;        // Counter hack (for the LOG_EVERY_X() macro)
    LogStream* self_;  // Consistency check hack
  }